

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

char * testing::internal::ParseFlagValue(char *str,char *flag,bool def_optional)

{
  _Alloc_hider _Var1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  char *pcVar6;
  char *pcVar7;
  size_type *local_90;
  string flag_str;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (flag == (char *)0x0 || str == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"--","");
    plVar3 = (long *)std::__cxx11::string::append((char *)local_50);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_60 = *plVar4;
      lStack_58 = plVar3[3];
      flag_str.field_2._8_8_ = &local_60;
    }
    else {
      local_60 = *plVar4;
      flag_str.field_2._8_8_ = (long *)*plVar3;
    }
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append(flag_str.field_2._M_local_buf + 8);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar5) {
      flag_str._M_string_length = *psVar5;
      flag_str.field_2._M_allocated_capacity = plVar3[3];
      local_90 = &flag_str._M_string_length;
    }
    else {
      flag_str._M_string_length = *psVar5;
      local_90 = (size_type *)*plVar3;
    }
    flag_str._M_dataplus._M_p = (pointer)plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((long *)flag_str.field_2._8_8_ != &local_60) {
      operator_delete((void *)flag_str.field_2._8_8_);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    _Var1._M_p = flag_str._M_dataplus._M_p;
    iVar2 = strncmp(str,(char *)local_90,(size_t)flag_str._M_dataplus._M_p);
    if (iVar2 == 0) {
      pcVar7 = str + (long)_Var1._M_p;
      if ((!def_optional) || (pcVar6 = pcVar7, *pcVar7 != '\0')) {
        pcVar6 = (char *)0x0;
        if (*pcVar7 == '=') {
          pcVar6 = pcVar7 + 1;
        }
      }
    }
    else {
      pcVar6 = (char *)0x0;
    }
    if (local_90 != &flag_str._M_string_length) {
      operator_delete(local_90);
    }
  }
  return pcVar6;
}

Assistant:

static const char* ParseFlagValue(const char* str, const char* flag,
                                  bool def_optional) {
  // str and flag must not be NULL.
  if (str == nullptr || flag == nullptr) return nullptr;

  // The flag must start with "--" followed by GTEST_FLAG_PREFIX_.
  const std::string flag_str = std::string("--") + GTEST_FLAG_PREFIX_ + flag;
  const size_t flag_len = flag_str.length();
  if (strncmp(str, flag_str.c_str(), flag_len) != 0) return nullptr;

  // Skips the flag name.
  const char* flag_end = str + flag_len;

  // When def_optional is true, it's OK to not have a "=value" part.
  if (def_optional && (flag_end[0] == '\0')) {
    return flag_end;
  }

  // If def_optional is true and there are more characters after the
  // flag name, or if def_optional is false, there must be a '=' after
  // the flag name.
  if (flag_end[0] != '=') return nullptr;

  // Returns the string after "=".
  return flag_end + 1;
}